

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::SkipWS(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this,bool skip_cr)

{
  Position *this_00;
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  eval_error *this_01;
  bool bVar4;
  char *pcVar5;
  byte *pbVar6;
  bool bVar7;
  allocator<char> local_59;
  undefined1 local_58 [32];
  File_Position local_38;
  
  this_00 = &this->m_position;
  bVar7 = false;
  while( true ) {
    bVar4 = bVar7;
    pbVar3 = (byte *)(this->m_position).m_pos;
    pbVar6 = (byte *)(this->m_position).m_end;
    if (pbVar3 == pbVar6) {
      return bVar4;
    }
    bVar1 = *pbVar3;
    if (0x7e < bVar1) break;
    if (bVar1 == 10) {
      bVar7 = true;
    }
    else if (bVar1 == 0xd) {
      Position::operator+((Position *)local_58,this_00,1);
      pcVar5 = "";
      if (local_58._8_8_ != local_58._16_8_) {
        pcVar5 = (char *)local_58._8_8_;
      }
      bVar7 = *pcVar5 == '\n';
      pbVar3 = (byte *)(this->m_position).m_pos;
      pbVar6 = (byte *)(this->m_position).m_end;
    }
    else {
      bVar7 = false;
    }
    if (pbVar3 == pbVar6) {
      pbVar3 = (byte *)0x59d7ab;
    }
    if ((m_alphabet._M_elems[9]._M_elems[*pbVar3] == false) && ((skip_cr & bVar7) == 0)) {
      bVar2 = SkipComment(this);
      bVar7 = true;
      if (!bVar2) {
        return bVar4;
      }
    }
    else {
      if (bVar7 == true && *pbVar3 == 0xd) {
        Position::operator++(this_00);
      }
      Position::operator++(this_00);
      bVar7 = true;
    }
  }
  this_01 = (eval_error *)__cxa_allocate_exception(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"Illegal character",&local_59);
  local_38.line = (this->m_position).line;
  local_38.column = (this->m_position).col;
  exception::eval_error::eval_error
            (this_01,(string *)local_58,&local_38,
             (this->m_filename).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  __cxa_throw(this_01,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

bool SkipWS(bool skip_cr = false) {
        bool retval = false;

        while (m_position.has_more()) {
          if (static_cast<unsigned char>(*m_position) > 0x7e) {
            throw exception::eval_error("Illegal character", File_Position(m_position.line, m_position.col), *m_filename);
          }
          auto end_line = (*m_position != 0) && ((*m_position == '\n') || (*m_position == '\r' && *(m_position + 1) == '\n'));

          if (char_in_alphabet(*m_position, detail::white_alphabet) || (skip_cr && end_line)) {
            if (end_line) {
              if (*m_position == '\r') {
                // discards lf
                ++m_position;
              }
            }

            ++m_position;

            retval = true;
          } else if (SkipComment()) {
            retval = true;
          } else {
            break;
          }
        }
        return retval;
      }